

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

LargeObjectHeader * __thiscall
Memory::LargeObjectHeader::GetNext(LargeObjectHeader *this,uint cookie)

{
  uchar calculatedChecksum;
  ushort uVar1;
  LargeObjectHeader *pLVar2;
  uchar calculatedCheckSumField;
  uchar checkSum;
  ushort decodedAttributesAndChecksum;
  LargeObjectHeader *decodedNext;
  uint cookie_local;
  LargeObjectHeader *this_local;
  
  pLVar2 = DecodeNext(this,cookie,this->next);
  uVar1 = DecodeAttributesAndChecksum(this,cookie);
  calculatedChecksum = CalculateCheckSum(this,pLVar2,(uchar)(uVar1 >> 8));
  if ((uchar)uVar1 != calculatedChecksum) {
    LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this,calculatedChecksum);
  }
  pLVar2 = DecodeNext(this,cookie,this->next);
  return pLVar2;
}

Assistant:

LargeObjectHeader *
LargeObjectHeader::GetNext(uint cookie)
{
#ifdef LARGEHEAPBLOCK_ENCODING
    LargeObjectHeader *decodedNext = this->DecodeNext(cookie, this->next);
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    unsigned char checkSum = (unsigned char)(decodedAttributesAndChecksum & 0xFF);
    unsigned char calculatedCheckSumField = this->CalculateCheckSum(decodedNext, (unsigned char)(decodedAttributesAndChecksum >> 8));
    if (checkSum != calculatedCheckSumField)
    {
        LargeHeapBlock_Metadata_Corrupted((ULONG_PTR)this, calculatedCheckSumField);
    }
    // If checksum matches return the up-to-date next (in case other thread changed it from last time
    // we read it in this method.
    return this->DecodeNext(cookie, this->next);

#else
    return this->next;
#endif
}